

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * cuddBddVarMapRecur(DdManager *manager,DdNode *f)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *h;
  DdNode *data;
  long lVar4;
  DdNode *f_00;
  timespec ts;
  timespec local_40;
  
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (f_00->index == 0x7fffffff) {
    return f;
  }
  if ((f_00->ref != 1) &&
     (pDVar3 = cuddCacheLookup1(manager,Cudd_bddVarMap,f_00), pDVar3 != (DdNode *)0x0)) {
    return (DdNode *)((ulong)pDVar3 ^ (ulong)(f_00 != f));
  }
  if (manager->TimeStop != 0) {
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    if (manager->TimeStop < lVar4) {
      return (DdNode *)0x0;
    }
  }
  pDVar3 = cuddBddVarMapRecur(manager,(f_00->type).kids.T);
  if (pDVar3 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    h = cuddBddVarMapRecur(manager,(f_00->type).kids.E);
    if (h != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      data = cuddBddIteRecur(manager,manager->vars[manager->map[f_00->index]],pDVar3,h);
      if (data != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_IterDerefBdd(manager,pDVar3);
        Cudd_IterDerefBdd(manager,h);
        if (f_00->ref != 1) {
          cuddCacheInsert1(manager,Cudd_bddVarMap,f_00,data);
        }
        piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return (DdNode *)((ulong)data ^ (ulong)(f_00 != f));
      }
      Cudd_IterDerefBdd(manager,pDVar3);
      pDVar3 = h;
    }
    Cudd_IterDerefBdd(manager,pDVar3);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddBddVarMapRecur(
  DdManager *manager /* DD manager */,
  DdNode *f /* BDD to be remapped */)
{
    DdNode      *F, *T, *E;
    DdNode      *res;
    int         index;

    statLine(manager);
    F = Cudd_Regular(f);

    /* Check for terminal case of constant node. */
    if (cuddIsConstant(F)) {
        return(f);
    }

    /* If problem already solved, look up answer and return. */
    if (F->ref != 1 &&
        (res = cuddCacheLookup1(manager,Cudd_bddVarMap,F)) != NULL) {
        return(Cudd_NotCond(res,F != f));
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    /* Split and recur on children of this node. */
    T = cuddBddVarMapRecur(manager,cuddT(F));
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddBddVarMapRecur(manager,cuddE(F));
    if (E == NULL) {
        Cudd_IterDerefBdd(manager, T);
        return(NULL);
    }
    cuddRef(E);

    /* Move variable that should be in this position to this position
    ** by retrieving the single var BDD for that variable, and calling
    ** cuddBddIteRecur with the T and E we just created.
    */
    index = manager->map[F->index];
    res = cuddBddIteRecur(manager,manager->vars[index],T,E);
    if (res == NULL) {
        Cudd_IterDerefBdd(manager, T);
        Cudd_IterDerefBdd(manager, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_IterDerefBdd(manager, T);
    Cudd_IterDerefBdd(manager, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (F->ref != 1) {
        cuddCacheInsert1(manager,Cudd_bddVarMap,F,res);
    }
    cuddDeref(res);
    return(Cudd_NotCond(res,F != f));

}